

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O3

void build_adjacent_table
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
               int **_AdjB,int *AdjP)

{
  pointer ppVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var5;
  iterator iVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var12;
  long lVar13;
  pair<int,_int> *e;
  pointer __args;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  int iVar18;
  undefined1 auVar17 [16];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> edges_alter;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_58;
  iterator iStack_50;
  pair<int,_int> *local_48;
  pair<int,_int> local_38;
  
  local_58._M_current = (pair<int,_int> *)0x0;
  iStack_50._M_current = (pair<int,_int> *)0x0;
  local_48 = (pair<int,_int> *)0x0;
  __args = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__args != ppVar1) {
    do {
      if (iStack_50._M_current == local_48) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>const&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                   iStack_50,__args);
      }
      else {
        *iStack_50._M_current = *__args;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      local_38.second = __args->first;
      local_38.first = __args->second;
      if (iStack_50._M_current == local_48) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                   iStack_50,&local_38);
      }
      else {
        *iStack_50._M_current = local_38;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      iVar6._M_current = iStack_50._M_current;
      _Var5._M_current = local_58._M_current;
      __args = __args + 1;
    } while (__args != ppVar1);
    if (local_58._M_current != iStack_50._M_current) {
      uVar7 = (long)iStack_50._M_current - (long)local_58._M_current >> 3;
      lVar8 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(std::pair<int,int>const&,std::pair<int,int>const&)>>
                (local_58,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                           )iStack_50._M_current,(ulong)(((uint)lVar8 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<int_(*)(const_std::pair<int,_int>_&,_const_std::pair<int,_int>_&)>
                 )0x114efc);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(std::pair<int,int>const&,std::pair<int,int>const&)>>
                (_Var5,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        )iVar6._M_current,
                 (_Iter_comp_iter<int_(*)(const_std::pair<int,_int>_&,_const_std::pair<int,_int>_&)>
                 )0x114efc);
    }
  }
  iVar6._M_current = iStack_50._M_current;
  _Var5._M_current = local_58._M_current;
  lVar8 = ((long)iStack_50._M_current - (long)local_58._M_current) * 0x20000000;
  uVar7 = 0xffffffffffffffff;
  if (-1 < lVar8) {
    uVar7 = lVar8 >> 0x1e;
  }
  piVar9 = (int *)operator_new__(uVar7);
  lVar8 = 0xffffffff;
  iVar15 = -1;
  lVar11 = 0;
  auVar2 = _DAT_001211d0;
  auVar3 = _DAT_001211e0;
  auVar4 = _DAT_001211f0;
  for (_Var12._M_current = _Var5._M_current; iVar10 = (int)lVar11, _DAT_001211d0 = auVar2,
      _DAT_001211e0 = auVar3, _DAT_001211f0 = auVar4, _Var12._M_current != iVar6._M_current;
      _Var12._M_current = _Var12._M_current + 1) {
    if ((int)lVar8 < (_Var12._M_current)->first) {
      lVar8 = (long)(int)lVar8;
      do {
        AdjP[lVar8 + 1] = iVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 < (_Var12._M_current)->first);
    }
    iVar15 = (int)lVar8;
    piVar9[lVar11] = (_Var12._M_current)->second;
    lVar11 = lVar11 + 1;
    auVar2 = _DAT_001211d0;
    auVar3 = _DAT_001211e0;
    auVar4 = _DAT_001211f0;
  }
  lVar8 = (long)size;
  if (iVar15 < size) {
    lVar13 = (long)iVar15;
    lVar11 = (lVar8 - lVar13) + -1;
    auVar14._8_4_ = (int)lVar11;
    auVar14._0_8_ = lVar11;
    auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar7 = 0;
    auVar14 = auVar14 ^ auVar4;
    do {
      auVar16._8_4_ = (int)uVar7;
      auVar16._0_8_ = uVar7;
      auVar16._12_4_ = (int)(uVar7 >> 0x20);
      auVar17 = (auVar16 | auVar3) ^ auVar4;
      iVar15 = auVar14._4_4_;
      if ((bool)(~(auVar17._4_4_ == iVar15 && auVar14._0_4_ < auVar17._0_4_ ||
                  iVar15 < auVar17._4_4_) & 1)) {
        AdjP[lVar13 + uVar7 + 1] = iVar10;
      }
      if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
          auVar17._12_4_ <= auVar14._12_4_) {
        AdjP[lVar13 + uVar7 + 2] = iVar10;
      }
      auVar16 = (auVar16 | auVar2) ^ auVar4;
      iVar18 = auVar16._4_4_;
      if (iVar18 <= iVar15 && (iVar18 != iVar15 || auVar16._0_4_ <= auVar14._0_4_)) {
        AdjP[lVar13 + uVar7 + 3] = iVar10;
        AdjP[lVar13 + uVar7 + 4] = iVar10;
      }
      uVar7 = uVar7 + 4;
    } while (((lVar8 - lVar13) + 3U & 0xfffffffffffffffc) != uVar7);
  }
  *_AdjB = piVar9;
  if (_Var5._M_current != (pair<int,_int> *)0x0) {
    operator_delete(_Var5._M_current);
  }
  return;
}

Assistant:

void build_adjacent_table(const vector<pair<int, int> > &edges, int **_AdjB, int *AdjP) {
    vector<pair<int, int> > edges_alter;
    for (auto &e : edges) {
        edges_alter.push_back(e);
        edges_alter.push_back(make_pair(e.second, e.first));
    }
    sort(edges_alter.begin(), edges_alter.end(), cmp_edges);
    int size_edge = edges_alter.size();
    int *AdjB = new int[size_edge];
    int curP = 0, curV = -1;
    for (auto &e: edges_alter) {
        if (e.first != curV) {
            //curV = e.first;
            for (curV += 1; curV <= e.first; ++curV)
                AdjP[curV] = curP;
            --curV;
        }
        AdjB[curP++] = e.second;
    }
    for (curV += 1; curV <= size; ++curV)
        AdjP[curV] = curP;
    
    *_AdjB = AdjB;
}